

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float128 float32_to_float128_mips(float32 a,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  commonNaNT a_00;
  float32 a_01;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  float128 fVar6;
  commonNaNT local_28;
  
  a_01 = float32_squash_input_denormal_mips(a,status);
  uVar5 = a_01 & 0x7fffff;
  uVar4 = (ulong)(a_01 >> 0x1f);
  if ((char)(a_01 >> 0x17) == '\0') {
    if (uVar5 == 0) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar4 << 0x3f;
      return (float128)(auVar2 << 0x40);
    }
    uVar3 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar5 = uVar5 << ((char)(uVar3 ^ 0x1f) - 8U & 0x1f);
    uVar3 = 8 - (uVar3 ^ 0x1f);
  }
  else {
    uVar3 = a_01 >> 0x17 & 0xff;
    if (uVar3 == 0xff) {
      if (uVar5 != 0) {
        float32ToCommonNaN(&local_28,a_01,status);
        a_00.high = local_28.high;
        a_00.sign = local_28.sign;
        a_00._1_7_ = local_28._1_7_;
        a_00.low = local_28.low;
        fVar6 = commonNaNToFloat128(a_00,status);
        return fVar6;
      }
      uVar4 = uVar4 << 0x3f | 0x7fff000000000000;
      goto LAB_00697870;
    }
  }
  uVar4 = ((ulong)(uVar3 + 0x3f80) << 0x30) + (uVar4 << 0x3f | (ulong)uVar5 << 0x19);
LAB_00697870:
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar4;
  return (float128)(auVar1 << 0x40);
}

Assistant:

float128 float32_to_float128(float32 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint32_t aSig;

    a = float32_squash_input_denormal(a, status);
    aSig = extractFloat32Frac( a );
    aExp = extractFloat32Exp( a );
    aSign = extractFloat32Sign( a );
    if ( aExp == 0xFF ) {
        if (aSig) {
            return commonNaNToFloat128(float32ToCommonNaN(a, status), status);
        }
        return packFloat128( aSign, 0x7FFF, 0, 0 );
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloat128( aSign, 0, 0, 0 );
        normalizeFloat32Subnormal( aSig, &aExp, &aSig );
        --aExp;
    }
    return packFloat128( aSign, aExp + 0x3F80, ( (uint64_t) aSig )<<25, 0 );

}